

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O0

void __thiscall
gmath::OrthoCamera::reconstructRay(OrthoCamera *this,Vector3d *V,Vector3d *C,Vector2d *p)

{
  _func_int **pp_Var1;
  double *pdVar2;
  Vector3d *a;
  SVector<double,_2> *in_RCX;
  SVector<double,_3> *in_RDX;
  SVector<double,_3> *in_RSI;
  Camera *in_RDI;
  double dVar3;
  SVector<double,_3> *in_stack_ffffffffffffffb0;
  SMatrix<double,_3,_3> *in_stack_ffffffffffffffb8;
  SVector<double,_3> local_38;
  SVector<double,_2> *local_20;
  SVector<double,_3> *local_18;
  SVector<double,_3> *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Camera::getR(in_RDI);
  SVector<double,_3>::SVector((SVector<double,_3> *)&stack0xffffffffffffffb0,0.0,0.0,-1.0);
  SMatrix<double,_3,_3>::operator*(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  SVector<double,_3>::operator=(local_10,&local_38);
  dVar3 = SVector<double,_2>::operator[](local_20,0);
  pp_Var1 = in_RDI[1]._vptr_Camera;
  pdVar2 = SVector<double,_3>::operator[](local_18,0);
  *pdVar2 = dVar3 * (double)pp_Var1;
  dVar3 = SVector<double,_2>::operator[](local_20,1);
  pp_Var1 = in_RDI[1]._vptr_Camera;
  pdVar2 = SVector<double,_3>::operator[](local_18,1);
  *pdVar2 = -dVar3 * (double)pp_Var1;
  pdVar2 = SVector<double,_3>::operator[](local_18,2);
  *pdVar2 = 0.0;
  a = Camera::getT(in_RDI);
  SVector<double,_3>::operator+=(local_18,a);
  return;
}

Assistant:

void OrthoCamera::reconstructRay(Vector3d &V, Vector3d &C, const Vector2d &p)
const
{
  V=getR()*Vector3d(0, 0, -1);

  C[0]=p[0]*res;
  C[1]=-p[1]*res;
  C[2]=0;

  C+=getT();
}